

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationsTest::getProgramInterface
          (VaryingLocationsTest *this,GLuint test_case_index,ProgramInterface *program_interface,
          VaryingPassthrough *varying_passthrough)

{
  Type TVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  Type local_48;
  undefined1 local_34 [8];
  Type type;
  VaryingPassthrough *varying_passthrough_local;
  ProgramInterface *program_interface_local;
  GLuint test_case_index_local;
  VaryingLocationsTest *this_local;
  
  type._4_8_ = varying_passthrough;
  TVar1 = TestBase::getType((TestBase *)this,test_case_index);
  local_48._0_8_ = TVar1._0_8_;
  local_34._0_4_ = local_48.m_basic_type;
  local_34._4_4_ = local_48.m_n_columns;
  local_48.m_n_rows = TVar1.m_n_rows;
  type.m_basic_type = local_48.m_n_rows;
  local_48 = TVar1;
  Utils::Type::GenerateDataPacked(&local_60,(Type *)local_34);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->m_first_data,&local_60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_60);
  Utils::Type::GenerateDataPacked(&local_78,(Type *)local_34);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->m_last_data,&local_78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_78);
  (*(this->super_TextureTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[0x21])(this,5,local_34,program_interface,type._4_8_);
  (*(this->super_TextureTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[0x21])(this,4,local_34,program_interface,type._4_8_);
  (*(this->super_TextureTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[0x21])(this,2,local_34,program_interface,type._4_8_);
  (*(this->super_TextureTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[0x21])(this,3,local_34,program_interface,type._4_8_);
  (*(this->super_TextureTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[0x21])(this,1,local_34,program_interface,type._4_8_);
  return;
}

Assistant:

void VaryingLocationsTest::getProgramInterface(GLuint test_case_index, Utils::ProgramInterface& program_interface,
											   Utils::VaryingPassthrough& varying_passthrough)
{
	const Utils::Type type = getType(test_case_index);

	m_first_data = type.GenerateDataPacked();
	m_last_data  = type.GenerateDataPacked();

	prepareShaderStage(Utils::Shader::FRAGMENT, type, program_interface, varying_passthrough);
	prepareShaderStage(Utils::Shader::GEOMETRY, type, program_interface, varying_passthrough);
	prepareShaderStage(Utils::Shader::TESS_CTRL, type, program_interface, varying_passthrough);
	prepareShaderStage(Utils::Shader::TESS_EVAL, type, program_interface, varying_passthrough);
	prepareShaderStage(Utils::Shader::VERTEX, type, program_interface, varying_passthrough);
}